

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O2

uint16_t __thiscall Bitvec16x16::Extract(Bitvec16x16 *this,int index)

{
  uint16_t uVar1;
  
  uVar1 = (*(code *)(&DAT_001084f0 + *(int *)(&DAT_001084f0 + (ulong)(uint)index * 4)))();
  return uVar1;
}

Assistant:

inline uint16_t Extract(int index) const {
#define CASE(x) case x: return _mm256_extract_epi16(vec, x);
        switch (index) {
            CASE(0)
            CASE(1)
            CASE(2)
            CASE(3)
            CASE(4)
            CASE(5)
            CASE(6)
            CASE(7)
            CASE(8)
            CASE(9)
            CASE(10)
            CASE(11)
            CASE(12)
            CASE(13)
            CASE(14)
            CASE(15)
        }
#undef CASE
    }